

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O2

void libdef_module(BuildCtx *ctx,char *p,int arg)

{
  if (ctx->mode == BUILD_libdef) {
    libdef_endmodule(ctx);
    obuf[0] = (uint8_t)ffid;
    obuf[1] = (uint8_t)ffasmfunc;
    optr = obuf + 3;
    obuf[2] = '\0';
    modstate = 1;
    fprintf((FILE *)ctx->fp,"#ifdef %sMODULE_%s\n","LJLIB_",p);
    fprintf((FILE *)ctx->fp,"#undef %sMODULE_%s\n","LJLIB_",p);
    fprintf((FILE *)ctx->fp,"static const lua_CFunction %s%s[] = {\n","lj_lib_cf_",p);
  }
  modnamelen = strlen(p);
  if (modnamelen < 0x50) {
    strcpy(modname,p);
    return;
  }
  fprintf(_stderr,"Error: module name too long: \'%s\'\n",p);
  exit(1);
}

Assistant:

static void libdef_module(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    libdef_endmodule(ctx);
    optr = obuf;
    *optr++ = (uint8_t)ffid;
    *optr++ = (uint8_t)ffasmfunc;
    *optr++ = 0;  /* Hash table size. */
    modstate = 1;
    fprintf(ctx->fp, "#ifdef %sMODULE_%s\n", LIBDEF_PREFIX, p);
    fprintf(ctx->fp, "#undef %sMODULE_%s\n", LIBDEF_PREFIX, p);
    fprintf(ctx->fp, "static const lua_CFunction %s%s[] = {\n",
	    LABEL_PREFIX_LIBCF, p);
  }
  modnamelen = strlen(p);
  if (modnamelen > sizeof(modname)-1) {
    fprintf(stderr, "Error: module name too long: '%s'\n", p);
    exit(1);
  }
  strcpy(modname, p);
}